

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O2

ktx_uint32_t ktxTexture_GetRowPitch(ktxTexture *This,ktx_uint32_t level)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  
  uVar1 = This->baseWidth / (This->_protected->_formatSize).blockWidth >> ((byte)level & 0x1f);
  uVar1 = (uVar1 + (uVar1 == 0)) * (This->_protected->_formatSize).blockSizeInBits >> 3;
  fVar2 = (float)uVar1;
  auVar3 = ZEXT416((uint)(fVar2 * 0.25));
  auVar3 = roundss(auVar3,auVar3,10);
  return uVar1 + (int)(long)(auVar3._0_4_ * 4.0 - fVar2);
}

Assistant:

ktx_uint32_t
 ktxTexture_GetRowPitch(ktxTexture* This, ktx_uint32_t level)
 {
    DECLARE_PROTECTED(ktxTexture)
    struct blockCount {
        ktx_uint32_t x;
    } blockCount;
    ktx_uint32_t pitch;

    blockCount.x = MAX(1, (This->baseWidth / prtctd->_formatSize.blockWidth)  >> level);
    pitch = blockCount.x * prtctd->_formatSize.blockSizeInBits / 8;
    (void)padRow(&pitch);

    return pitch;
 }